

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O0

Instr * __thiscall
LowererMDArch::LowerWasmArrayBoundsCheck(LowererMDArch *this,Instr *instr,Opnd *addrOpnd)

{
  Lowerer *pLVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  IndirOpnd *this_00;
  RegOpnd *this_01;
  undefined4 *puVar6;
  IntConstOpnd *pIVar7;
  JITTimeFunctionBody *this_02;
  Opnd *pOVar8;
  LabelInstr *target;
  LabelInstr *target_00;
  Int64ConstOpnd *dst;
  Int64ConstOpnd *local_70;
  Opnd *cmpOpnd;
  Int64ConstOpnd *constOffsetOpnd;
  Opnd *arrayLenOpnd;
  uint32 offset;
  LabelInstr *doneLabel;
  LabelInstr *loadLabel;
  LabelInstr *helperLabel;
  RegOpnd *indexOpnd;
  IndirOpnd *indirOpnd;
  Opnd *addrOpnd_local;
  Instr *instr_local;
  LowererMDArch *this_local;
  
  this_00 = IR::Opnd::AsIndirOpnd(addrOpnd);
  this_01 = IR::IndirOpnd::GetIndexOpnd(this_00);
  this_local = (LowererMDArch *)instr;
  if ((this_01 == (RegOpnd *)0x0) || (bVar3 = IR::Opnd::IsIntegral32(&this_01->super_Opnd), bVar3))
  {
    this_02 = Func::GetJITFunctionBody(this->m_func);
    bVar3 = JITTimeFunctionBody::UsesWAsmJsFastVirtualBuffer(this_02);
    if (!bVar3) {
      pOVar8 = IR::Instr::GetSrc2(instr);
      if (pOVar8 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                           ,0x462,"(instr->GetSrc2())","instr->GetSrc2()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      target = Lowerer::InsertLabel(true,instr);
      target_00 = Lowerer::InsertLabel(false,instr);
      this_local = (LowererMDArch *)Lowerer::InsertLabel(false,instr);
      uVar4 = IR::IndirOpnd::GetOffset(this_00);
      pOVar8 = IR::Instr::GetSrc2(instr);
      iVar5 = IR::Opnd::GetSize(addrOpnd);
      local_70 = IR::Int64ConstOpnd::New((long)iVar5 + (ulong)uVar4,TyInt64,this->m_func);
      if (this_01 != (RegOpnd *)0x0) {
        dst = (Int64ConstOpnd *)IR::RegOpnd::New(TyInt64,this->m_func);
        Lowerer::InsertAdd(true,(Opnd *)dst,&this_01->super_Opnd,&local_70->super_Opnd,
                           &target->super_Instr);
        local_70 = dst;
      }
      Lowerer::InsertCompareBranch
                (this->lowererMD->m_lowerer,&local_70->super_Opnd,pOVar8,BrGt_A,true,target,
                 &target->super_Instr,false);
      pLVar1 = this->lowererMD->m_lowerer;
      pIVar7 = IR::IntConstOpnd::New(-0x7ff5e497,TyInt32,this->m_func,false);
      Lowerer::GenerateThrow(pLVar1,&pIVar7->super_Opnd,&target_00->super_Instr);
      Lowerer::InsertBranch(Br,target_00,&target->super_Instr);
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x459,"((0))","UNREACHED");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
    pLVar1 = this->lowererMD->m_lowerer;
    pIVar7 = IR::IntConstOpnd::New(-0x7ff5e497,TyInt32,this->m_func,false);
    Lowerer::GenerateThrow(pLVar1,&pIVar7->super_Opnd,instr);
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
LowererMDArch::LowerWasmArrayBoundsCheck(IR::Instr * instr, IR::Opnd *addrOpnd)
{
    IR::IndirOpnd * indirOpnd = addrOpnd->AsIndirOpnd();
    IR::RegOpnd * indexOpnd = indirOpnd->GetIndexOpnd();
    if (indexOpnd && !indexOpnd->IsIntegral32())
    {
        // We don't expect the index to be anything other than an int32 or uint32
        // Having an int32 index guaranties that int64 index add doesn't overflow
        // If we're wrong, just throw index out of range
        Assert(UNREACHED);
        lowererMD->m_lowerer->GenerateThrow(IR::IntConstOpnd::New(WASMERR_ArrayIndexOutOfRange, TyInt32, m_func), instr);
        return instr;
    }
    if (m_func->GetJITFunctionBody()->UsesWAsmJsFastVirtualBuffer())
    {
        return instr;
    }

    Assert(instr->GetSrc2());
    IR::LabelInstr * helperLabel = Lowerer::InsertLabel(true, instr);
    IR::LabelInstr * loadLabel = Lowerer::InsertLabel(false, instr);
    IR::LabelInstr * doneLabel = Lowerer::InsertLabel(false, instr);

    // Find array buffer length
    uint32 offset = indirOpnd->GetOffset();
    IR::Opnd *arrayLenOpnd = instr->GetSrc2();
    IR::Int64ConstOpnd * constOffsetOpnd = IR::Int64ConstOpnd::New((int64)addrOpnd->GetSize() + (int64)offset, TyInt64, m_func);
    IR::Opnd *cmpOpnd;
    if (indexOpnd != nullptr)
    {
        // Compare index + memop access length and array buffer length, and generate RuntimeError if greater
        cmpOpnd = IR::RegOpnd::New(TyInt64, m_func);
        Lowerer::InsertAdd(true, cmpOpnd, indexOpnd, constOffsetOpnd, helperLabel);
    }
    else
    {
        cmpOpnd = constOffsetOpnd;
    }
    lowererMD->m_lowerer->InsertCompareBranch(cmpOpnd, arrayLenOpnd, Js::OpCode::BrGt_A, true, helperLabel, helperLabel);
    lowererMD->m_lowerer->GenerateThrow(IR::IntConstOpnd::New(WASMERR_ArrayIndexOutOfRange, TyInt32, m_func), loadLabel);
    Lowerer::InsertBranch(Js::OpCode::Br, loadLabel, helperLabel);
    return doneLabel;
}